

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

DynamicProfileInfo * __thiscall Js::FunctionBody::EnsureDynamicProfileInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  if ((*(uint *)&this->field_0x178 & 0x20000100) == 0) {
    bVar2 = DynamicProfileInfo::IsEnabled(this);
    if (bVar2) {
      ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
                ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,this,
                 &this->dynamicProfileInfo);
      uVar3 = *(uint *)&this->field_0x178;
      if ((uVar3 >> 8 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xdf2,"(!this->HasExecutionDynamicProfileInfo())",
                                    "!this->HasExecutionDynamicProfileInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        uVar3 = *(uint *)&this->field_0x178;
      }
      *(uint *)&this->field_0x178 = uVar3 | 0x100;
    }
  }
  return (this->dynamicProfileInfo).ptr;
}

Assistant:

DynamicProfileInfo * FunctionBody::EnsureDynamicProfileInfo()
    {
        if (this->NeedEnsureDynamicProfileInfo())
        {
            m_scriptContext->AddDynamicProfileInfo(this, this->dynamicProfileInfo);
            Assert(!this->HasExecutionDynamicProfileInfo());
            this->hasExecutionDynamicProfileInfo = true;
        }

        return this->dynamicProfileInfo;
    }